

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromDarSeqSweep(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  Nm_Man_t *pNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint n;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pObj_00;
  int nDigits;
  int iNodeId;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObj;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pMan_local;
  Abc_Ntk_t *pNtkOld_local;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1dc,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pNtkOld->nBarBufs == 0) {
    pNtk = Abc_NtkStartFromNoLatches(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pNtk->nConstrs = pMan->nConstrs;
    pNtk->nBarBufs = pMan->nBarBufs;
    iVar2 = Abc_NtkCiNum(pNtk);
    iVar3 = Aig_ManCiNum(pMan);
    iVar4 = Aig_ManRegNum(pMan);
    if (iVar2 < iVar3 - iVar4) {
      iVar2 = Aig_ManCiNum(pMan);
      iVar3 = Aig_ManRegNum(pMan);
      iVar4 = Abc_NtkCiNum(pNtk);
      for (nDigits = (iVar2 - iVar3) - iVar4; 0 < nDigits; nDigits = nDigits + -1) {
        pAVar5 = Abc_NtkCreatePi(pNtk);
        pcVar6 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      }
      Abc_NtkOrderCisCos(pNtk);
    }
    iVar2 = Abc_NtkCiNum(pNtk);
    iVar3 = Aig_ManCiNum(pMan);
    iVar4 = Aig_ManRegNum(pMan);
    if (iVar2 == iVar3 - iVar4) {
      iVar2 = Abc_NtkCoNum(pNtk);
      iVar3 = Aig_ManCoNum(pMan);
      iVar4 = Aig_ManRegNum(pMan);
      if (iVar2 != iVar3 - iVar4) {
        __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                      ,0x1ee,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
      }
      pAVar5 = Abc_AigConst1(pNtk);
      pAVar7 = Aig_ManConst1(pMan);
      (pAVar7->field_5).pData = pAVar5;
      nDigits = 0;
      while( true ) {
        iVar2 = Aig_ManCiNum(pMan);
        iVar3 = Aig_ManRegNum(pMan);
        if (iVar2 - iVar3 <= nDigits) break;
        pvVar8 = Vec_PtrEntry(pMan->vCis,nDigits);
        pAVar5 = Abc_NtkCi(pNtk,nDigits);
        *(Abc_Obj_t **)((long)pvVar8 + 0x28) = pAVar5;
        nDigits = nDigits + 1;
      }
      for (nDigits = 0; iVar2 = Aig_ManRegNum(pMan), nDigits < iVar2; nDigits = nDigits + 1) {
        pAVar7 = Aig_ManLi(pMan,nDigits);
        pAVar9 = Aig_ManLo(pMan,nDigits);
        pAVar5 = Abc_NtkCreateLatch(pNtk);
        pAVar10 = Abc_NtkCreateBi(pNtk);
        (pAVar7->field_5).pData = pAVar10;
        pAVar10 = Abc_NtkCreateBo(pNtk);
        (pAVar9->field_5).pData = pAVar10;
        Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)(pAVar7->field_5).pData);
        Abc_ObjAddFanin((Abc_Obj_t *)(pAVar9->field_5).pData,pAVar5);
        Abc_LatchSetInit0(pAVar5);
      }
      p = Aig_ManDfs(pMan,1);
      for (nDigits = 0; iVar2 = Vec_PtrSize(p), nDigits < iVar2; nDigits = nDigits + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p,nDigits);
        iVar2 = Aig_ObjIsBuf(pAVar7);
        if (iVar2 == 0) {
          pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar5 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar7);
          pAVar10 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar7);
          pAVar5 = Abc_AigAnd(pMan_00,pAVar5,pAVar10);
          (pAVar7->field_5).pData = pAVar5;
        }
        else {
          pAVar9 = Aig_ObjChild0Copy(pAVar7);
          (pAVar7->field_5).pData = pAVar9;
        }
      }
      Vec_PtrFree(p);
      for (nDigits = 0; iVar2 = Vec_PtrSize(pMan->vCos), nDigits < iVar2; nDigits = nDigits + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,nDigits);
        pNVar1 = pNtk->pManName;
        pAVar5 = Abc_NtkCo(pNtk,nDigits);
        pcVar6 = Abc_ObjName(pAVar5);
        iVar2 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar6,2,5);
        if (iVar2 < 0) {
          pLatch = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar7);
        }
        else {
          pLatch = Abc_NtkObj(pNtk,iVar2);
        }
        pAVar5 = Abc_NtkCo(pNtk,nDigits);
        Abc_ObjAddFanin(pAVar5,pLatch);
      }
      if (pMan->vFlopNums == (Vec_Int_t *)0x0) {
        Abc_NtkAddDummyBoxNames(pNtk);
      }
      else {
        iVar2 = Abc_NtkBoxNum(pNtkOld);
        iVar3 = Abc_NtkLatchNum(pNtkOld);
        if (iVar2 != iVar3) {
          __assert_fail("Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                        ,0x22a,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
        }
        n = Abc_NtkLatchNum(pNtk);
        iVar2 = Abc_Base10Log(n);
        for (nDigits = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), nDigits < iVar3; nDigits = nDigits + 1)
        {
          pAVar5 = Abc_NtkBox(pNtk,nDigits);
          iVar3 = Abc_ObjIsLatch(pAVar5);
          if (iVar3 != 0) {
            iVar3 = Vec_IntEntry(pMan->vFlopNums,nDigits);
            pAVar10 = Abc_NtkBox(pNtkOld,iVar3);
            pNVar1 = pNtk->pManName;
            pAVar11 = Abc_ObjFanout0(pAVar10);
            pcVar6 = Abc_ObjName(pAVar11);
            iVar3 = Nm_ManFindIdByName(pNVar1,pcVar6,3);
            if (iVar3 < 0) {
              pcVar6 = Abc_ObjName(pAVar10);
              Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
              pAVar11 = Abc_ObjFanin0(pAVar5);
              pObj_00 = Abc_ObjFanin0(pAVar10);
              pcVar6 = Abc_ObjName(pObj_00);
              Abc_ObjAssignName(pAVar11,pcVar6,(char *)0x0);
              pAVar5 = Abc_ObjFanout0(pAVar5);
              pAVar10 = Abc_ObjFanout0(pAVar10);
              pcVar6 = Abc_ObjName(pAVar10);
              Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
            }
            else {
              pcVar6 = Abc_ObjNameDummy("l",nDigits,iVar2);
              Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
              pAVar10 = Abc_ObjFanin0(pAVar5);
              pcVar6 = Abc_ObjNameDummy("li",nDigits,iVar2);
              Abc_ObjAssignName(pAVar10,pcVar6,(char *)0x0);
              pAVar5 = Abc_ObjFanout0(pAVar5);
              pcVar6 = Abc_ObjNameDummy("lo",nDigits,iVar2);
              Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
            }
          }
        }
      }
      iVar2 = Abc_NtkCheck(pNtk);
      if (iVar2 == 0) {
        Abc_Print(1,"Abc_NtkFromDar(): Network check has failed.\n");
      }
      return pNtk;
    }
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1ed,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  __assert_fail("pNtkOld->nBarBufs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x1dd,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pLatch;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i, iNodeId, nDigits; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
//    assert( Aig_ManRegNum(pMan) != Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFromNoLatches( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // consider the case of target enlargement
    if ( Abc_NtkCiNum(pNtkNew) < Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) )
    {
        for ( i = Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) - Abc_NtkCiNum(pNtkNew); i > 0; i-- )
        {
            pObjNew = Abc_NtkCreatePi( pNtkNew );
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        }
        Abc_NtkOrderCisCos( pNtkNew );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachPiSeq( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
//        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
//            break;
        iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(Abc_NtkCo(pNtkNew, i)), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( iNodeId >= 0 )
            pObjNew = Abc_NtkObj( pNtkNew, iNodeId );
        else
            pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    if ( pMan->vFlopNums == NULL )
        Abc_NtkAddDummyBoxNames( pNtkNew );
    else
    {
/*
        {
            int i, k, iFlop, Counter = 0;
            FILE * pFile;
            pFile = fopen( "out.txt", "w" );
            fAbc_Print( 1, pFile, "The total of %d registers were removed (out of %d):\n", 
                Abc_NtkLatchNum(pNtkOld)-Vec_IntSize(pMan->vFlopNums), Abc_NtkLatchNum(pNtkOld) );
            for ( i = 0; i < Abc_NtkLatchNum(pNtkOld); i++ )
            {
                Vec_IntForEachEntry( pMan->vFlopNums, iFlop, k )
                {
                    if ( i == iFlop )
                        break;
                }
                if ( k == Vec_IntSize(pMan->vFlopNums) )
                    fAbc_Print( 1, pFile, "%6d (%6d)  :  %s\n", ++Counter, i, Abc_ObjName( Abc_ObjFanout0(Abc_NtkBox(pNtkOld, i)) ) );
            }
            fclose( pFile );
            //Abc_Print( 1, "\n" );
        }
*/
        assert( Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld) );
        nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtkNew) );
        Abc_NtkForEachLatch( pNtkNew, pObjNew, i )
        {
            pLatch = Abc_NtkBox( pNtkOld, Vec_IntEntry( pMan->vFlopNums, i ) );
            iNodeId = Nm_ManFindIdByName( pNtkNew->pManName, Abc_ObjName(Abc_ObjFanout0(pLatch)), ABC_OBJ_PO );
            if ( iNodeId >= 0 )
            {
                Abc_ObjAssignName( pObjNew, Abc_ObjNameDummy("l", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanin0(pObjNew), Abc_ObjNameDummy("li", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjNameDummy("lo", i, nDigits), NULL );
//Abc_Print( 1, "happening   %s -> %s\n", Abc_ObjName(Abc_ObjFanin0(pObjNew)), Abc_ObjName(Abc_ObjFanout0(pObjNew)) );
                continue;
            }
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pLatch), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pLatch)), NULL );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pLatch)), NULL );
        }
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
    return pNtkNew;
}